

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkSupport(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  int *piVar6;
  Vec_Ptr_t *vNodes;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar9;
  undefined8 extraout_RDX_05;
  int iVar10;
  int iVar11;
  long lVar12;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar10 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar10 + 500;
    iVar11 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar11) {
      piVar6 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar11;
    }
    if (-500 < iVar10) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar11;
  }
  iVar10 = pNtk->nTravIds;
  pNtk->nTravIds = iVar10 + 1;
  if (0x3ffffffe < iVar10) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vNodes->pArray = ppvVar7;
  pVVar8 = pNtk->vCos;
  uVar9 = extraout_RDX;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      Abc_NtkNodeSupport_rec
                (*(Abc_Obj_t **)
                  (*(long *)(*(long *)(*pVVar8->pArray[lVar12] + 0x20) + 8) +
                  (long)**(int **)((long)pVVar8->pArray[lVar12] + 0x20) * 8),vNodes);
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCos;
      uVar9 = extraout_RDX_00;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vCis;
  iVar10 = pVVar8->nSize;
  if (0 < iVar10) {
    lVar12 = 0;
    do {
      plVar4 = (long *)pVVar8->pArray[lVar12];
      lVar5 = *plVar4;
      iVar10 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,(int)uVar9);
      if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = extraout_RDX_01;
      if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) != *(int *)(*plVar4 + 0xd8)) {
        uVar2 = vNodes->nSize;
        uVar3 = vNodes->nCap;
        if (uVar2 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
              uVar9 = extraout_RDX_04;
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
              uVar9 = extraout_RDX_02;
            }
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar3 * 2;
            if (iVar10 <= (int)uVar3) goto LAB_0084db24;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
              uVar9 = extraout_RDX_05;
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
              uVar9 = extraout_RDX_03;
            }
          }
          vNodes->pArray = ppvVar7;
          vNodes->nCap = iVar10;
        }
LAB_0084db24:
        vNodes->nSize = uVar2 + 1;
        vNodes->pArray[(int)uVar2] = plVar4;
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCis;
      iVar10 = pVVar8->nSize;
    } while (lVar12 < iVar10);
  }
  if (vNodes->nSize != iVar10) {
    __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x36b,"Vec_Ptr_t *Abc_NtkSupport(Abc_Ntk_t *)");
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkSupport( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkNodeSupport_rec( Abc_ObjFanin0(pNode), vNodes );
    // add unused CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        if ( !Abc_NodeIsTravIdCurrent( pNode ) )
            Vec_PtrPush( vNodes, pNode );
    assert( Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk) );
    return vNodes;
}